

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>
mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>(Impl *impl)

{
  bool bVar1;
  Kind k;
  char *message;
  ExprBase in_RDI;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> expr;
  AssertionFailure *in_stack_ffffffffffffffe0;
  
  if (in_RDI.impl_ != (Impl *)0x0) {
    k = Impl::kind(in_RDI.impl_);
    bVar1 = Is<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>(k);
    if (!bVar1) {
      message = (char *)__cxa_allocate_exception(0x10);
      AssertionFailure::AssertionFailure(in_stack_ffffffffffffffe0,message);
      __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
    }
  }
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x15b852);
  return (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)(ExprBase)in_RDI.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }